

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

void __thiscall Market::display(Market *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"BIDS:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = operator<<((ostream *)&std::cout,(Order *)&p_Var2[1]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ASKS:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_askOrders)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = operator<<((ostream *)&std::cout,(Order *)&p_Var2[1]._M_parent);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Market::display() const
{
  BidOrders::const_iterator iBid;
  AskOrders::const_iterator iAsk;

  std::cout << "BIDS:" << std::endl;
  std::cout << "-----" << std::endl << std::endl;
  for ( iBid = m_bidOrders.begin(); iBid != m_bidOrders.end(); ++iBid )
    std::cout << iBid->second << std::endl;

  std::cout << std::endl << std::endl;

  std::cout << "ASKS:" << std::endl;
  std::cout << "-----" << std::endl << std::endl;
  for ( iAsk = m_askOrders.begin(); iAsk != m_askOrders.end(); ++iAsk )
    std::cout << iAsk->second << std::endl;
}